

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)4>::
dispatch<false,TI::TMS::CharacterSequencer<(TI::TMS::Personality)4>>
          (Base<(TI::TMS::Personality)4> *this,CharacterSequencer<(TI::TMS::Personality)4> *fetcher,
          int start,int end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  Base<(TI::TMS::Personality)4> *pBVar33;
  
  switch(start) {
  case 0:
    do_external_slot((fetcher->character_fetcher).base,0);
  case 1:
    do_external_slot((fetcher->character_fetcher).base,2);
  case 2:
    do_external_slot((fetcher->character_fetcher).base,4);
  case 3:
    do_external_slot((fetcher->character_fetcher).base,6);
  case 4:
    do_external_slot((fetcher->character_fetcher).base,8);
  case 5:
    CharacterSequencer<(TI::TMS::Personality)4>::fetch<5>(fetcher);
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    do_external_slot((fetcher->character_fetcher).base,0x1e);
  case 0x10:
    do_external_slot((fetcher->character_fetcher).base,0x20);
  case 0x11:
    do_external_slot((fetcher->character_fetcher).base,0x22);
  case 0x12:
    do_external_slot((fetcher->character_fetcher).base,0x24);
  case 0x13:
    CharacterSequencer<(TI::TMS::Personality)4>::fetch<19>(fetcher);
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ = (ushort)(pBVar33->ram_)._M_elems[(fetcher->character_fetcher).row_base];
  case 0x1c:
    do_external_slot((fetcher->character_fetcher).base,0x38);
  case 0x1d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar1._0_2_ = pBVar33->tile_offset_;
    uVar1._2_1_ = pBVar33->name_[0];
    uVar1._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar1 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x1e:
  case 0x1f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 1];
  case 0x20:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,8,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffa0],
                 (fetcher->sprite_fetcher).y);
  case 0x21:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar2._0_2_ = pBVar33->tile_offset_;
    uVar2._2_1_ = pBVar33->name_[0];
    uVar2._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[1][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar2 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[1][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x22:
  case 0x23:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 2];
  case 0x24:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,9,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffa4],
                 (fetcher->sprite_fetcher).y);
  case 0x25:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar3._0_2_ = pBVar33->tile_offset_;
    uVar3._2_1_ = pBVar33->name_[0];
    uVar3._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[2][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar3 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[2][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x26:
  case 0x27:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 3];
  case 0x28:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,10,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffa8],
                 (fetcher->sprite_fetcher).y);
  case 0x29:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar4._0_2_ = pBVar33->tile_offset_;
    uVar4._2_1_ = pBVar33->name_[0];
    uVar4._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[3][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar4 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[3][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x2a:
  case 0x2b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 4];
  case 0x2c:
    do_external_slot((fetcher->character_fetcher).base,0x58);
  case 0x2d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar5._0_2_ = pBVar33->tile_offset_;
    uVar5._2_1_ = pBVar33->name_[0];
    uVar5._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[4][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar5 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[4][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x2e:
  case 0x2f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 5];
  case 0x30:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0xb,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffac],
                 (fetcher->sprite_fetcher).y);
  case 0x31:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar6._0_2_ = pBVar33->tile_offset_;
    uVar6._2_1_ = pBVar33->name_[0];
    uVar6._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[5][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar6 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[5][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x32:
  case 0x33:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 6];
  case 0x34:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0xc,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffb0],
                 (fetcher->sprite_fetcher).y);
  case 0x35:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar7._0_2_ = pBVar33->tile_offset_;
    uVar7._2_1_ = pBVar33->name_[0];
    uVar7._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[6][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar7 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[6][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x36:
  case 0x37:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 7];
  case 0x38:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0xd,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffb4],
                 (fetcher->sprite_fetcher).y);
  case 0x39:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar8._0_2_ = pBVar33->tile_offset_;
    uVar8._2_1_ = pBVar33->name_[0];
    uVar8._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[7][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar8 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[7][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x3a:
  case 0x3b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 8];
  case 0x3c:
    do_external_slot((fetcher->character_fetcher).base,0x78);
  case 0x3d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar9._0_2_ = pBVar33->tile_offset_;
    uVar9._2_1_ = pBVar33->name_[0];
    uVar9._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[8][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar9 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[8][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x3e:
  case 0x3f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 9];
  case 0x40:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0xe,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffb8],
                 (fetcher->sprite_fetcher).y);
  case 0x41:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar10._0_2_ = pBVar33->tile_offset_;
    uVar10._2_1_ = pBVar33->name_[0];
    uVar10._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[9][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar10 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[9][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x42:
  case 0x43:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 10];
  case 0x44:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0xf,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffbc],
                 (fetcher->sprite_fetcher).y);
  case 0x45:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar11._0_2_ = pBVar33->tile_offset_;
    uVar11._2_1_ = pBVar33->name_[0];
    uVar11._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[10][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar11 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[10][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x46:
  case 0x47:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xb];
  case 0x48:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x10,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffc0],
                 (fetcher->sprite_fetcher).y);
  case 0x49:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar12._0_2_ = pBVar33->tile_offset_;
    uVar12._2_1_ = pBVar33->name_[0];
    uVar12._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xb][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar12 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xb][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x4a:
  case 0x4b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xc];
  case 0x4c:
    do_external_slot((fetcher->character_fetcher).base,0x98);
  case 0x4d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar13._0_2_ = pBVar33->tile_offset_;
    uVar13._2_1_ = pBVar33->name_[0];
    uVar13._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xc][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar13 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xc][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x4e:
  case 0x4f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xd];
  case 0x50:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x11,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffc4],
                 (fetcher->sprite_fetcher).y);
  case 0x51:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar14._0_2_ = pBVar33->tile_offset_;
    uVar14._2_1_ = pBVar33->name_[0];
    uVar14._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xd][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar14 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xd][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x52:
  case 0x53:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xe];
  case 0x54:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x12,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffc8],
                 (fetcher->sprite_fetcher).y);
  case 0x55:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar15._0_2_ = pBVar33->tile_offset_;
    uVar15._2_1_ = pBVar33->name_[0];
    uVar15._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xe][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar15 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xe][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x56:
  case 0x57:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0xf];
  case 0x58:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x13,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffcc],
                 (fetcher->sprite_fetcher).y);
  case 0x59:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar16._0_2_ = pBVar33->tile_offset_;
    uVar16._2_1_ = pBVar33->name_[0];
    uVar16._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xf][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar16 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0xf][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x5a:
  case 0x5b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x10];
  case 0x5c:
    do_external_slot((fetcher->character_fetcher).base,0xb8);
  case 0x5d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar17._0_2_ = pBVar33->tile_offset_;
    uVar17._2_1_ = pBVar33->name_[0];
    uVar17._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x10][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar17 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x10][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x5e:
  case 0x5f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x11];
  case 0x60:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x14,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffd0],
                 (fetcher->sprite_fetcher).y);
  case 0x61:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar18._0_2_ = pBVar33->tile_offset_;
    uVar18._2_1_ = pBVar33->name_[0];
    uVar18._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x11][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar18 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x11][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x62:
  case 99:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x12];
  case 100:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x15,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffd4],
                 (fetcher->sprite_fetcher).y);
  case 0x65:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar19._0_2_ = pBVar33->tile_offset_;
    uVar19._2_1_ = pBVar33->name_[0];
    uVar19._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x12][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar19 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x12][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x66:
  case 0x67:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x13];
  case 0x68:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x16,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffd8],
                 (fetcher->sprite_fetcher).y);
  case 0x69:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar20._0_2_ = pBVar33->tile_offset_;
    uVar20._2_1_ = pBVar33->name_[0];
    uVar20._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x13][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar20 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x13][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x6a:
  case 0x6b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x14];
  case 0x6c:
    do_external_slot((fetcher->character_fetcher).base,0xd8);
  case 0x6d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar21._0_2_ = pBVar33->tile_offset_;
    uVar21._2_1_ = pBVar33->name_[0];
    uVar21._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x14][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar21 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x14][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x6e:
  case 0x6f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x15];
  case 0x70:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x17,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffdc],
                 (fetcher->sprite_fetcher).y);
  case 0x71:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar22._0_2_ = pBVar33->tile_offset_;
    uVar22._2_1_ = pBVar33->name_[0];
    uVar22._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x15][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar22 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x15][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x72:
  case 0x73:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x16];
  case 0x74:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x18,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffe0],
                 (fetcher->sprite_fetcher).y);
  case 0x75:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar23._0_2_ = pBVar33->tile_offset_;
    uVar23._2_1_ = pBVar33->name_[0];
    uVar23._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x16][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar23 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x16][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x76:
  case 0x77:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x17];
  case 0x78:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x19,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffe4],
                 (fetcher->sprite_fetcher).y);
  case 0x79:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar24._0_2_ = pBVar33->tile_offset_;
    uVar24._2_1_ = pBVar33->name_[0];
    uVar24._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x17][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar24 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x17][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x7a:
  case 0x7b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x18];
  case 0x7c:
    do_external_slot((fetcher->character_fetcher).base,0xf8);
  case 0x7d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar25._0_2_ = pBVar33->tile_offset_;
    uVar25._2_1_ = pBVar33->name_[0];
    uVar25._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x18][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar25 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x18][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x7e:
  case 0x7f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x19];
  case 0x80:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x1a,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffe8],
                 (fetcher->sprite_fetcher).y);
  case 0x81:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar26._0_2_ = pBVar33->tile_offset_;
    uVar26._2_1_ = pBVar33->name_[0];
    uVar26._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x19][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar26 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x19][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x82:
  case 0x83:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1a];
  case 0x84:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x1b,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xffffffec],
                 (fetcher->sprite_fetcher).y);
  case 0x85:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar27._0_2_ = pBVar33->tile_offset_;
    uVar27._2_1_ = pBVar33->name_[0];
    uVar27._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1a][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar27 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1a][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x86:
  case 0x87:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1b];
  case 0x88:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x1c,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xfffffff0],
                 (fetcher->sprite_fetcher).y);
  case 0x89:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar28._0_2_ = pBVar33->tile_offset_;
    uVar28._2_1_ = pBVar33->name_[0];
    uVar28._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1b][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar28 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1b][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x8a:
  case 0x8b:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1c];
  case 0x8c:
    do_external_slot((fetcher->character_fetcher).base,0x118);
  case 0x8d:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar29._0_2_ = pBVar33->tile_offset_;
    uVar29._2_1_ = pBVar33->name_[0];
    uVar29._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1c][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar29 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1c][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x8e:
  case 0x8f:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1d];
  case 0x90:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x1d,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xfffffff4],
                 (fetcher->sprite_fetcher).y);
  case 0x91:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar30._0_2_ = pBVar33->tile_offset_;
    uVar30._2_1_ = pBVar33->name_[0];
    uVar30._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1d][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar30 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1d][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x92:
  case 0x93:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1e];
  case 0x94:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x1e,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xfffffff8],
                 (fetcher->sprite_fetcher).y);
  case 0x95:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar31._0_2_ = pBVar33->tile_offset_;
    uVar31._2_1_ = pBVar33->name_[0];
    uVar31._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1e][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar31 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1e][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x96:
  case 0x97:
    pBVar33 = (fetcher->character_fetcher).base;
    pBVar33->tile_offset_ =
         (ushort)(pBVar33->ram_)._M_elems[(ulong)(fetcher->character_fetcher).row_base + 0x1f];
  case 0x98:
    pBVar33 = (fetcher->sprite_fetcher).base;
    posit_sprite(pBVar33,0x1f,
                 (uint)(pBVar33->ram_)._M_elems
                       [pBVar33->sprite_attribute_table_address_ & 0xfffffffc],
                 (fetcher->sprite_fetcher).y);
  case 0x99:
    pBVar33 = (fetcher->character_fetcher).base;
    uVar32._0_2_ = pBVar33->tile_offset_;
    uVar32._2_1_ = pBVar33->name_[0];
    uVar32._3_1_ = pBVar33->name_[1];
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1f][0] =
         (pBVar33->ram_)._M_elems
         [(ulong)(fetcher->character_fetcher).pattern_base + (ulong)(uVar32 & 0x1fff) * 8];
    pBVar33 = (fetcher->character_fetcher).base;
    (pBVar33->fetch_line_buffer_->field_5).tiles.patterns[0x1f][1] =
         (pBVar33->ram_)._M_elems
         [(ulong)(((uint)pBVar33->tile_offset_ << 3) >>
                  ((byte)(fetcher->character_fetcher).colour_name_shift & 0x1f) & 0xffff) +
          (ulong)(fetcher->character_fetcher).colour_base];
  case 0x9a:
  case 0x9b:
    do_external_slot((fetcher->character_fetcher).base,0x136);
  case 0x9c:
    do_external_slot((fetcher->character_fetcher).base,0x138);
  case 0x9d:
    CharacterSequencer<(TI::TMS::Personality)4>::fetch<157>(fetcher);
    return;
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMS2VDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMS2VDP, use_end = false, Fetcher = TI::TMS::CharacterSequencer<TI::TMS::SMS2VDP>]"
                 );
  }
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}